

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

int pbrt::RandomWalk(Integrator *integrator,SampledWavelengths *lambda,RayDifferential *ray,
                    SamplerHandle *sampler,CameraHandle *camera,ScratchBuffer *scratchBuffer,
                    SampledSpectrum beta,Float pdf,int maxDepth,TransportMode mode,Vertex *path,
                    bool regularize)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  Transform *this;
  undefined1 *puVar2;
  int *piVar3;
  DenselySampledSpectrum *pDVar4;
  Vertex *this_00;
  Vertex *prev;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  BxDFFlags flags;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Interval IVar19;
  Interval IVar20;
  bool bVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  bool bVar27;
  int iVar28;
  ShapeIntersection *pSVar29;
  uint64_t sequenceIndex;
  uint64_t seed;
  BSDFSample *pBVar30;
  BSDFSample *pBVar31;
  ShapeIntersection *pSVar32;
  Vector3f *pVVar33;
  DenselySampledSpectrum *pDVar34;
  Vector3f *pVVar35;
  ulong uVar36;
  DenselySampledSpectrum *this_01;
  int iVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int *piVar41;
  int *piVar42;
  float *pfVar43;
  int iVar44;
  int iVar45;
  Float *pFVar46;
  long in_FS_OFFSET;
  undefined1 auVar47 [16];
  Float FVar48;
  type tVar49;
  Point2f u2;
  undefined8 uVar135;
  undefined1 auVar50 [16];
  undefined1 auVar53 [32];
  undefined1 auVar137 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar51 [16];
  undefined1 auVar54 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined8 uVar136;
  undefined1 auVar52 [16];
  undefined1 auVar55 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar223 [60];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar233;
  undefined1 auVar236 [12];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 in_ZMM4 [64];
  float fVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar244;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  undefined1 auVar251 [12];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 in_ZMM7 [64];
  Vector3<float> VVar252;
  Point3f PVar253;
  Point3f p;
  Point3<float> PVar254;
  Vector3f woRender;
  Vector3f wi;
  SampledSpectrum SVar255;
  SampledSpectrum SVar256;
  Vector3f wiRender;
  bool scattered;
  bool anyNonSpecularBounces;
  bool terminated;
  undefined1 local_5f8 [16];
  float local_5e4;
  Float tMax;
  int bounces;
  undefined1 local_5d8 [16];
  Float pdfFwd;
  Float tMin;
  int voxel [3];
  Float nextCrossingT [3];
  SampledSpectrum d;
  Ray local_590;
  SampledSpectrum TmajAccum;
  Tuple3<pbrt::Point3,_float> local_558;
  float local_548;
  float fStack_544;
  undefined8 uStack_540;
  SampledSpectrum Tmaj_1;
  SampledSpectrum sigma_maj;
  optional<pbrt::BSDFSample> bs;
  undefined1 local_4d8 [16];
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  SampledSpectrum sigma_a;
  BSDF bsdf;
  SampledSpectrum beta_local;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a_3;
  Float FStack_3c0;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  SampledSpectrum sigma_t;
  undefined1 local_328 [24];
  anon_union_248_3_83785cfc_for_Vertex_2 local_310;
  Interval *local_1c8;
  CameraHandle *local_1c0;
  ScratchBuffer *local_1b8;
  Integrator *local_1b0;
  uintptr_t local_1a8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1a0;
  RNG rng;
  ulong uStack_180;
  SampledSpectrum Tmaj;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar64 [64];
  undefined1 extraout_var [60];
  undefined1 auVar152 [64];
  undefined1 auVar180 [64];
  undefined1 auVar224 [56];
  
  auVar146._8_56_ = beta._16_56_;
  auVar146._0_8_ = beta.values.values._8_8_;
  auVar231._8_56_ = beta._8_56_;
  auVar231._0_8_ = beta.values.values._0_8_;
  beta_local.values.values = (array<float,_4>)vmovlhps_avx(auVar231._0_16_,auVar146._0_16_);
  if (maxDepth == 0) {
    bounces = 0;
  }
  else {
    local_1c8 = (Interval *)&ray->hasDifferentials;
    bounces = 0;
    bVar21 = false;
    pdfFwd = pdf;
    local_1c0 = camera;
    local_1b8 = scratchBuffer;
    local_1b0 = integrator;
    while (bVar27 = SampledSpectrum::operator_cast_to_bool(&beta_local), bVar27) {
      terminated = false;
      this_00 = path + bounces;
      prev = path + (long)bounces + -1;
      Integrator::Intersect(&si,local_1b0,&ray->super_Ray,INFINITY);
      if (((ray->super_Ray).medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           .bits & 0xffffffffffff) != 0) {
        FVar48 = INFINITY;
        if (si.set == true) {
          pSVar29 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          FVar48 = pSVar29->tHit;
        }
        local_5f8._0_4_ = FVar48;
        sequenceIndex = Hash<float>((ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x);
        seed = Hash<float>((ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y);
        RNG::SetSequence(&rng,sequenceIndex,seed);
        FVar48 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
        uVar25 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
        uVar22 = local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_4d8._0_4_ = FVar48;
        uVar36 = (ray->super_Ray).medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
        this_01 = (DenselySampledSpectrum *)(uVar36 & 0xffffffffffff);
        local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(this_01,0);
        uVar23 = local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
        local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar36;
        uVar24 = local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
        uVar12 = (uint)((ulong)this_01 >> 0x20);
        local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
             (float)(uVar36 >> 0x20);
        uVar26 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
        bsdf.bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
        .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                 )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                   )sampler;
        bsdf.shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>._4_8_ = this_00;
        bsdf.shadingFrame._20_8_ = prev;
        local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar22;
        local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar25;
        if (uVar36 < 0x3000000000000) {
          if ((uVar36 & 0x3000000000000) == 0x2000000000000) {
            bsdf._16_8_ = &beta_local;
            sigma_a_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
            sigma_a_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
            uVar136 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar10._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
            auVar10._12_4_ = (ray->super_Ray).time;
            auVar224 = ZEXT856(auVar10._8_8_);
            sigma_a_3.values.values[2] = (float)uVar136;
            sigma_a_3.values.values[3] = (float)((ulong)uVar136 >> 0x20);
            bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &terminated;
            bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &pdfFwd;
            bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._4_8_ = &bounces;
            local_5e4 = (float)local_5f8._0_4_;
            SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
            Transform::ApplyInverse
                      ((Ray *)&bs,(Transform *)(this_01 + 3),(Ray *)&sigma_a_3,&local_5e4);
            tVar49 = Length<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            local_5e4 = tVar49 * local_5e4;
            auVar137 = (undefined1  [56])0x0;
            VVar252 = Normalize<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            bs.optionalValue._20_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar56._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar56._8_56_ = auVar137;
            uVar136 = vmovlps_avx(auVar56._0_16_);
            bs.optionalValue._12_4_ = (undefined4)uVar136;
            bs.optionalValue._16_4_ = (undefined4)((ulong)uVar136 >> 0x20);
            pvVar1 = &this_01->values;
            bVar27 = Bounds3<float>::IntersectP
                               ((Bounds3<float> *)pvVar1,(Point3f *)&bs,
                                (Vector3f *)((long)&bs.optionalValue + 0xc),local_5e4,&tMin,&tMax);
            auVar251 = in_ZMM7._4_12_;
            auVar236 = in_ZMM4._4_12_;
            if (bVar27) {
              auVar137 = (undefined1  [56])0x0;
              local_5f8._0_4_ = *(Float *)&this_01[2].values.nStored;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
              auVar147._0_8_ = SVar255.values.values._8_8_;
              auVar147._8_56_ = auVar224;
              auVar57._0_8_ = SVar255.values.values._0_8_;
              auVar57._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar57._0_16_,auVar147._0_16_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar148._0_8_ = SVar255.values.values._8_8_;
              auVar148._8_56_ = auVar224;
              auVar58._0_8_ = SVar255.values.values._0_8_;
              auVar58._8_56_ = auVar137;
              sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar58._0_16_,auVar148._0_16_);
              local_5f8._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
              auVar149._0_8_ = SVar255.values.values._8_8_;
              auVar149._8_56_ = auVar224;
              auVar59._0_8_ = SVar255.values.values._0_8_;
              auVar59._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar59._0_16_,auVar149._0_16_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar150._0_8_ = SVar255.values.values._8_8_;
              auVar150._8_56_ = auVar224;
              auVar60._0_8_ = SVar255.values.values._0_8_;
              auVar60._8_56_ = auVar137;
              sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar60._0_16_,auVar150._0_16_);
              auVar137 = ZEXT856(sigma_s.values.values._8_8_);
              SVar255 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
              auVar151._0_8_ = SVar255.values.values._8_8_;
              auVar151._8_56_ = auVar224;
              auVar61._0_8_ = SVar255.values.values._0_8_;
              auVar61._8_56_ = auVar137;
              sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar61._0_16_,auVar151._0_16_);
              auVar137 = ZEXT856(sigma_t.values.values._8_8_);
              VVar252 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
              auVar223 = auVar151._4_60_;
              local_5f8._0_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar62._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar62._8_56_ = auVar137;
              local_5d8 = auVar62._0_16_;
              VVar252 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&bs);
              local_590.o.super_Tuple3<pbrt::Point3,_float>.z =
                   VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar63._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar63._8_56_ = auVar137;
              auVar225._4_4_ = bs.optionalValue._16_4_;
              auVar225._0_4_ = bs.optionalValue._12_4_;
              auVar225._8_8_ = 0;
              local_590.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar63._0_16_);
              auVar137 = (undefined1  [56])0x0;
              auVar47 = vdivps_avx(auVar225,local_5d8);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.z =
                   (float)bs.optionalValue._20_4_ / (float)local_5f8._0_4_;
              uVar136 = vmovlps_avx(auVar47);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar136;
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar136 >> 0x20);
              local_590.time = 0.0;
              local_590.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )0;
              PVar253 = Ray::operator()(&local_590,tMin);
              uVar22 = local_310._60_4_;
              auVar152._0_4_ = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
              auVar152._4_60_ = auVar223;
              auVar64._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar64._8_56_ = auVar137;
              piVar3 = &this_01[7].lambda_max;
              uVar12 = this_01[7].lambda_min;
              uVar36 = CONCAT44(0,uVar12);
              auVar227 = vmovshdup_avx(auVar64._0_16_);
              auVar235 = ZEXT816(0) << 0x40;
              pDVar4 = this_01 + 7;
              lVar40 = 0;
              iVar28 = this_01[7].lambda_max;
              local_5d8._0_8_ = uVar36;
              fVar232 = (float)iVar28;
              auVar238._0_4_ = (float)(iVar28 + -1);
              auVar238._4_12_ = auVar236;
              auVar245._0_4_ = (float)(int)(uVar12 - 1);
              auVar245._4_12_ = auVar236;
              iVar37 = *(int *)&this_01[7].values.alloc.memoryResource;
              auVar234 = ZEXT416((uint)(auVar227._0_4_ * fVar232));
              auVar47 = vminss_avx(auVar238,auVar234);
              uVar136 = vcmpss_avx512f(auVar234,auVar235,1);
              fVar233 = (float)(int)uVar12;
              in_ZMM4 = ZEXT1664(CONCAT124(auVar251,fVar233));
              iVar44 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              auVar234 = ZEXT416((uint)(PVar253.super_Tuple3<pbrt::Point3,_float>.x * fVar233));
              auVar47 = vminss_avx(auVar245,auVar234);
              uVar136 = vcmpss_avx512f(auVar234,auVar235,1);
              fVar237 = (float)iVar37;
              auVar249._0_4_ = (float)(iVar37 + -1);
              auVar249._4_12_ = auVar251;
              iVar37 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              auVar47 = vminss_avx(auVar249,ZEXT416((uint)(auVar152._0_4_ * fVar237)));
              uVar136 = vcmpss_avx512f(ZEXT416((uint)(auVar152._0_4_ * fVar237)),auVar235,1);
              iVar38 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              in_ZMM7 = ZEXT464((uint)tMin);
              local_5f8._0_4_ = tMin;
              for (; lVar40 != 3; lVar40 = lVar40 + 1) {
                iVar39 = (int)lVar40;
                if (iVar39 == 1) {
                  voxel[1] = iVar44;
                  piVar41 = voxelLimit + 1;
                  piVar42 = step + 1;
                  pFVar46 = deltaT + 1;
                  pfVar43 = nextCrossingT + 1;
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                  iVar45 = iVar44;
                }
                else if (iVar39 == 0) {
                  voxel[lVar40] = iVar37;
                  piVar41 = voxelLimit;
                  piVar42 = step;
                  pFVar46 = deltaT;
                  pfVar43 = nextCrossingT;
                  pVVar33 = &local_590.d;
                  iVar45 = iVar37;
                }
                else {
                  piVar41 = voxelLimit + 2;
                  piVar42 = step + 2;
                  pFVar46 = deltaT + 2;
                  pfVar43 = nextCrossingT + 2;
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                  voxel[lVar40] = iVar38;
                  iVar45 = iVar38;
                }
                fVar244 = (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x;
                if ((fVar244 == 0.0) && (!NAN(fVar244))) {
                  pVVar33 = &local_590.d;
                  if ((iVar39 != 0) &&
                     (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     iVar39 != 1)) {
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                  }
                  (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x = 0.0;
                }
                pVVar33 = &local_590.d;
                if ((iVar39 != 0) &&
                   (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                   iVar39 != 1)) {
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                }
                if (0.0 <= (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x) {
                  pVVar33 = &local_590.d;
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  fVar248 = PVar253.super_Tuple3<pbrt::Point3,_float>.x;
                  if ((iVar39 != 0) &&
                     (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     pDVar34 = (DenselySampledSpectrum *)piVar3, fVar244 = fVar232,
                     fVar248 = auVar227._0_4_, iVar39 != 1)) {
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                    fVar244 = fVar237;
                    fVar248 = auVar152._0_4_;
                  }
                  *piVar42 = 1;
                  fVar5 = (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x;
                  fVar248 = ((float)(iVar45 + 1) / fVar244 - fVar248) / fVar5 + tMin;
                  in_ZMM7 = ZEXT464((uint)fVar248);
                  *pfVar43 = fVar248;
                  *pFVar46 = 1.0 / (fVar5 * fVar244);
                  iVar39 = pDVar34->lambda_min;
                }
                else {
                  pVVar33 = &local_590.d;
                  in_ZMM7 = ZEXT1664(auVar64._0_16_);
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  if (iVar39 != 0) {
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    in_ZMM7 = ZEXT1664(auVar227);
                    pDVar34 = (DenselySampledSpectrum *)piVar3;
                    fVar244 = fVar232;
                    if (iVar39 != 1) {
                      pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      in_ZMM7 = ZEXT1664(auVar152._0_16_);
                      pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                      fVar244 = fVar237;
                    }
                  }
                  fVar248 = (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x;
                  *pfVar43 = ((float)iVar45 / fVar244 - in_ZMM7._0_4_) / fVar248 + tMin;
                  iVar39 = pDVar34->lambda_min;
                  *piVar42 = -1;
                  *pFVar46 = -1.0 / (fVar248 * (float)iVar39);
                  iVar39 = -1;
                }
                *piVar41 = iVar39;
              }
              puVar2 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
              local_310._60_4_ = (uint)((ulong)puVar2 >> 0x20) | 0x10000;
              uVar23 = local_310._60_4_;
              local_310._60_4_ = uVar22;
              while( true ) {
                iVar37 = *(int *)(&DAT_0053dd60 +
                                 (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                        (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                        (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                fVar232 = nextCrossingT[iVar37];
                auVar224 = (undefined1  [56])0x0;
                auVar47 = vminss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)tMax));
                local_548 = auVar47._0_4_;
                auVar137 = (undefined1  [56])0x0;
                SVar255 = SampledSpectrum::operator*
                                    (&sigma_t,this_01[6].values.ptr
                                              [(long)((iVar28 * voxel[2] + voxel[1]) * (int)uVar36)
                                               + (long)voxel[0]]);
                auVar172._0_8_ = SVar255.values.values._8_8_;
                auVar172._8_56_ = auVar224;
                auVar90._0_8_ = SVar255.values.values._0_8_;
                auVar90._8_56_ = auVar137;
                auVar231 = ZEXT1664(auVar90._0_16_);
                sigma_maj.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar90._0_16_,auVar172._0_16_);
                auVar137 = ZEXT856(sigma_maj.values.values._8_8_);
                if ((SVar255.values.values[0] != 0.0) || (NAN(SVar255.values.values[0]))) {
                  while( true ) {
                    FVar48 = SampleExponential((Float)local_4d8._0_4_,auVar231._0_4_);
                    local_5d8._0_4_ = FVar48;
                    fVar233 = RNG::Uniform<float>(&rng);
                    auVar47 = in_ZMM7._0_16_;
                    local_4d8._0_4_ = fVar233;
                    auVar137 = (undefined1  [56])0x0;
                    fVar233 = (float)local_5d8._0_4_ + (float)local_5f8._0_4_;
                    auVar224 = (undefined1  [56])0x0;
                    if (local_548 <= fVar233) break;
                    auVar137 = (undefined1  [56])0x0;
                    if (fVar233 < tMax) {
                      local_5d8._0_4_ = fVar233;
                      SVar255 = SampledSpectrum::operator-(&sigma_maj);
                      auVar176._0_8_ = SVar255.values.values._8_8_;
                      auVar176._8_56_ = auVar224;
                      auVar94._0_8_ = SVar255.values.values._0_8_;
                      auVar94._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar94._0_16_,auVar176._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      SVar255 = SampledSpectrum::operator*
                                          (&d,(float)local_5d8._0_4_ - (float)local_5f8._0_4_);
                      auVar177._0_8_ = SVar255.values.values._8_8_;
                      auVar177._8_56_ = auVar224;
                      auVar95._0_8_ = SVar255.values.values._0_8_;
                      auVar95._8_56_ = auVar137;
                      auVar227 = vmovlhps_avx(auVar95._0_16_,auVar177._0_16_);
                      auVar137 = ZEXT856(auVar227._8_8_);
                      local_328._0_8_ = auVar227._0_8_;
                      local_328._8_4_ = auVar227._8_4_;
                      local_328._12_4_ = auVar227._12_4_;
                      SVar255 = FastExp((SampledSpectrum *)local_328);
                      auVar178._0_8_ = SVar255.values.values._8_8_;
                      auVar178._8_56_ = auVar224;
                      auVar96._0_8_ = SVar255.values.values._0_8_;
                      auVar96._8_56_ = auVar137;
                      Tmaj_1.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar96._0_16_,auVar178._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      PVar253 = Ray::operator()((Ray *)&bs,(Float)local_5d8._0_4_);
                      local_558.z = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar97._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      auVar97._8_56_ = auVar137;
                      local_558._0_8_ = vmovlps_avx(auVar97._0_16_);
                      SVar255 = UniformGridMediumProvider::Density
                                          (*(UniformGridMediumProvider **)this_01,
                                           (Point3f *)&local_558,lambda);
                      auVar179._0_8_ = SVar255.values.values._8_8_;
                      auVar179._8_56_ = auVar224;
                      auVar98._0_8_ = SVar255.values.values._0_8_;
                      auVar98._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar98._0_16_,auVar179._0_16_);
                      p.super_Tuple3<pbrt::Point3,_float>.z = local_558.z;
                      p.super_Tuple3<pbrt::Point3,_float>.x = local_558.x;
                      p.super_Tuple3<pbrt::Point3,_float>.y = local_558.y;
                      auVar137 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                      uVar135 = 0;
                      SVar255 = UniformGridMediumProvider::Le
                                          (*(UniformGridMediumProvider **)this_01,p,lambda);
                      auVar180._0_8_ = SVar255.values.values._8_8_;
                      auVar180._8_56_ = auVar137;
                      local_5f8._8_8_ = uVar135;
                      local_5f8._0_8_ = SVar255.values.values._0_8_;
                      SVar256 = SampledSpectrum::operator*(&sigma_a,&d);
                      auVar181._0_8_ = SVar256.values.values._8_8_;
                      auVar181._8_56_ = auVar137;
                      uStack_180 = auVar137._0_8_;
                      auVar137 = ZEXT856(uStack_180);
                      local_358._8_8_ = uVar135;
                      SVar255 = SampledSpectrum::operator*(&sigma_s,&d);
                      auVar182._0_8_ = SVar255.values.values._8_8_;
                      auVar182._8_56_ = auVar137;
                      local_358._0_8_ = SVar255.values.values._0_8_;
                      SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                      SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
                      uVar36 = CONCAT44(local_328._12_4_,local_328._8_4_);
                      TmajAccum.values.values[2] = (float)local_328._8_4_;
                      TmajAccum.values.values[3] = (float)local_328._12_4_;
                      TmajAccum.values.values[0] = (float)local_328._0_4_;
                      TmajAccum.values.values[1] = (float)local_328._4_4_;
                      PVar254 = Transform::operator()
                                          ((Transform *)(this_01 + 3),(Point3<float> *)&local_558);
                      fVar233 = PVar254.super_Tuple3<pbrt::Point3,_float>.z;
                      local_378._8_8_ = uVar36;
                      local_378._0_8_ = PVar254.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      VVar252 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                      auVar234 = local_310._128_16_;
                      SVar255 = Tmaj_1;
                      auVar228._8_4_ = 0x80000000;
                      auVar228._0_8_ = 0x8000000080000000;
                      auVar228._12_4_ = 0x80000000;
                      auVar241._4_4_ = fVar233;
                      auVar241._0_4_ = fVar233;
                      auVar241._8_4_ = fVar233;
                      auVar241._12_4_ = fVar233;
                      local_310._96_16_ = (undefined1  [16])sigma_maj.values.values;
                      local_310._16_16_ = ZEXT816(0);
                      auVar50._0_8_ =
                           VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar50._8_8_ = uVar36 ^ auVar228._8_8_;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
                           -VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar227 = vpermilps_avx(local_378,0x50);
                      local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                      local_328._0_8_ = auVar227._0_8_;
                      local_328._8_4_ = auVar227._8_4_;
                      local_328._12_4_ = auVar227._12_4_;
                      uVar136 = vmovlps_avx(auVar241);
                      local_328._16_4_ = (undefined4)uVar136;
                      local_328._20_4_ = (undefined4)((ulong)uVar136 >> 0x20);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)auVar10._12_4_;
                      uVar136 = vmovlpd_avx(auVar50);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar136;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                           (Float)((ulong)uVar136 >> 0x20);
                      auVar53._16_16_ = auVar182._0_16_;
                      auVar53._0_16_ = auVar50;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                           SUB84(puVar2,0);
                      auVar140._16_16_ = auVar181._0_16_;
                      auVar140._0_16_ = auVar50;
                      auVar55 = vperm2f128_avx(auVar140,auVar53,0x31);
                      auVar141._8_8_ = uVar135;
                      auVar141._0_8_ = SVar256.values.values._0_8_;
                      auVar141._16_16_ = local_358;
                      auVar55 = vunpcklpd_avx(auVar141,auVar55);
                      local_310._64_4_ = auVar55._0_4_;
                      local_310._68_12_ = auVar55._4_12_;
                      local_310.ei.field_0 = auVar55._16_8_;
                      local_310._88_8_ = auVar55._24_8_;
                      local_310._112_16_ = vunpcklpd_avx(local_5f8,auVar180._0_16_);
                      local_310.mi.sigma_maj.values.values[2] = Tmaj_1.values.values[0];
                      local_310.mi.sigma_maj.values.values[3] = Tmaj_1.values.values[1];
                      local_310._128_16_ = auVar234;
                      in_ZMM4 = ZEXT1664(auVar227);
                      in_ZMM7 = ZEXT1664(auVar47);
                      Tmaj_1 = SVar255;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                           (float)uVar24;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                           (float)uVar26;
                      local_310._60_4_ = uVar23;
                      bVar27 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                         ((anon_class_88_11_14aa307c *)&bsdf,
                                          (MediumSample *)local_328);
                      if (!bVar27) goto LAB_0041dfd1;
                      fVar233 = (float)local_5d8._0_4_;
                    }
                    auVar231 = ZEXT464((uint)sigma_maj.values.values[0]);
                    local_5f8._0_4_ = fVar233;
                  }
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar183._0_8_ = SVar255.values.values._8_8_;
                  auVar183._8_56_ = auVar224;
                  auVar99._0_8_ = SVar255.values.values._0_8_;
                  auVar99._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar99._0_16_,auVar183._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar184._0_8_ = SVar255.values.values._8_8_;
                  auVar184._8_56_ = auVar224;
                  auVar100._0_8_ = SVar255.values.values._0_8_;
                  auVar100._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar100._0_16_,auVar184._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar185._0_8_ = SVar255.values.values._8_8_;
                  auVar185._8_56_ = auVar224;
                  auVar227 = auVar185._0_16_;
                  auVar101._0_8_ = SVar255.values.values._0_8_;
                  auVar101._8_56_ = auVar137;
                  auVar47 = auVar101._0_16_;
                }
                else {
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar173._0_8_ = SVar255.values.values._8_8_;
                  auVar173._8_56_ = auVar224;
                  auVar91._0_8_ = SVar255.values.values._0_8_;
                  auVar91._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar91._0_16_,auVar173._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar174._0_8_ = SVar255.values.values._8_8_;
                  auVar174._8_56_ = auVar224;
                  auVar92._0_8_ = SVar255.values.values._0_8_;
                  auVar92._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar92._0_16_,auVar174._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar175._0_8_ = SVar255.values.values._8_8_;
                  auVar175._8_56_ = auVar224;
                  auVar227 = auVar175._0_16_;
                  auVar93._0_8_ = SVar255.values.values._0_8_;
                  auVar93._8_56_ = auVar137;
                  auVar47 = auVar93._0_16_;
                }
                auVar47 = vmovlhps_avx(auVar47,auVar227);
                local_328._0_8_ = auVar47._0_8_;
                local_328._8_4_ = auVar47._8_4_;
                local_328._12_4_ = auVar47._12_4_;
                SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_328);
                if ((tMax < fVar232) ||
                   (iVar28 = voxel[iVar37], voxel[iVar37] = iVar28 + step[iVar37],
                   iVar28 + step[iVar37] == voxelLimit[iVar37])) break;
                local_5f8._0_4_ = local_548;
                nextCrossingT[iVar37] = fVar232 + deltaT[iVar37];
                uVar36 = (ulong)(uint)pDVar4->lambda_min;
                iVar28 = *piVar3;
              }
              goto LAB_0041dfd1;
            }
            SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
            goto LAB_0041dfe3;
          }
          bsdf._16_8_ = &beta_local;
          bs.optionalValue._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          bs.optionalValue._4_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          uVar136 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar11._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
          auVar11._12_4_ = (ray->super_Ray).time;
          auVar224 = ZEXT856(auVar11._8_8_);
          bs.optionalValue._16_4_ = auVar11._4_4_;
          bs.optionalValue._20_4_ = auVar11._8_4_;
          bs.optionalValue._8_4_ = (undefined4)uVar136;
          bs.optionalValue._12_4_ = (undefined4)((ulong)uVar136 >> 0x20);
          bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &terminated;
          bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &pdfFwd;
          bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._4_8_ = &bounces;
          bs.optionalValue._24_4_ = auVar11._12_4_;
          bs.optionalValue._32_8_ = uVar36;
          tVar49 = Length<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
          fVar232 = tVar49 * (float)local_5f8._0_4_;
          auVar137 = (undefined1  [56])0x0;
          local_5f8 = ZEXT416((uint)fVar232);
          bVar27 = ABS(fVar232) == INFINITY;
          VVar252 = Normalize<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
          bs.optionalValue._20_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar74._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar74._8_56_ = auVar137;
          uVar136 = vmovlpd_avx(auVar74._0_16_);
          bs.optionalValue._12_4_ = (undefined4)uVar136;
          bs.optionalValue._16_4_ = (undefined4)((ulong)uVar136 >> 0x20);
          auVar137 = (undefined1  [56])0x0;
          local_5d8._0_4_ = this_01[3].lambda_min;
          SVar255 = DenselySampledSpectrum::Sample(this_01,lambda);
          auVar159._0_8_ = SVar255.values.values._8_8_;
          auVar159._8_56_ = auVar224;
          auVar75._0_8_ = SVar255.values.values._0_8_;
          auVar75._8_56_ = auVar137;
          auVar47 = vmovlhps_avx(auVar75._0_16_,auVar159._0_16_);
          local_328._0_8_ = auVar47._0_8_;
          local_328._8_4_ = auVar47._8_4_;
          local_328._12_4_ = auVar47._12_4_;
          auVar137 = (undefined1  [56])0x0;
          SVar255 = SampledSpectrum::operator*((SampledSpectrum *)local_328,(Float)local_5d8._0_4_);
          auVar160._0_8_ = SVar255.values.values._8_8_;
          auVar160._8_56_ = auVar224;
          auVar76._0_8_ = SVar255.values.values._0_8_;
          auVar76._8_56_ = auVar137;
          auVar47 = vmovlhps_avx(auVar76._0_16_,auVar160._0_16_);
          sigma_a_3.values.values._0_8_ = auVar47._0_8_;
          sigma_a_3.values.values[2] = auVar47._8_4_;
          sigma_a_3.values.values[3] = auVar47._12_4_;
          auVar137 = (undefined1  [56])0x0;
          local_5d8._0_4_ = this_01[3].lambda_min;
          SVar255 = DenselySampledSpectrum::Sample(this_01 + 1,lambda);
          auVar161._0_8_ = SVar255.values.values._8_8_;
          auVar161._8_56_ = auVar224;
          auVar77._0_8_ = SVar255.values.values._0_8_;
          auVar77._8_56_ = auVar137;
          auVar47 = vmovlhps_avx(auVar77._0_16_,auVar161._0_16_);
          local_328._0_8_ = auVar47._0_8_;
          local_328._8_4_ = auVar47._8_4_;
          local_328._12_4_ = auVar47._12_4_;
          auVar137 = (undefined1  [56])0x0;
          local_5f8 = ZEXT416((uint)bVar27 * 0x7f7fffff + (uint)!bVar27 * local_5f8._0_4_);
          SVar255 = SampledSpectrum::operator*((SampledSpectrum *)local_328,(Float)local_5d8._0_4_);
          auVar162._0_8_ = SVar255.values.values._8_8_;
          auVar162._8_56_ = auVar224;
          auVar78._0_8_ = SVar255.values.values._0_8_;
          auVar78._8_56_ = auVar137;
          TmajAccum.values.values = (array<float,_4>)vmovlhps_avx(auVar78._0_16_,auVar162._0_16_);
          auVar137 = ZEXT856(TmajAccum.values.values._8_8_);
          SVar255 = SampledSpectrum::operator+(&sigma_a_3,&TmajAccum);
          auVar163._0_8_ = SVar255.values.values._8_8_;
          auVar163._8_56_ = auVar224;
          auVar79._0_8_ = SVar255.values.values._0_8_;
          auVar79._8_56_ = auVar137;
          sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar79._0_16_,auVar163._0_16_);
          fVar232 = SVar255.values.values[0];
          if ((fVar232 != 0.0) || (NAN(fVar232))) {
            auVar137 = ZEXT856(auVar137._0_8_);
            auVar130._0_4_ = SampleExponential(FVar48,fVar232);
            auVar130._4_60_ = extraout_var;
            if (local_5f8._0_4_ <= auVar130._0_4_) {
              auVar16._8_4_ = 0x80000000;
              auVar16._0_8_ = 0x8000000080000000;
              auVar16._12_4_ = 0x80000000;
              auVar47 = vxorps_avx512vl(local_5f8,auVar16);
              auVar224 = ZEXT856(auVar47._8_8_);
              SVar255 = SampledSpectrum::operator*(&sigma_a,auVar47._0_4_);
              auVar221._0_8_ = SVar255.values.values._8_8_;
              auVar221._8_56_ = auVar137;
              auVar134._0_8_ = SVar255.values.values._0_8_;
              auVar134._8_56_ = auVar224;
              auVar47 = vmovlhps_avx(auVar134._0_16_,auVar221._0_16_);
              auVar224 = ZEXT856(auVar47._8_8_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              SVar255 = FastExp((SampledSpectrum *)local_328);
              auVar222._0_8_ = SVar255.values.values._8_8_;
              auVar222._8_56_ = auVar137;
              auVar138 = auVar222._0_16_;
              auVar126._0_8_ = SVar255.values.values._0_8_;
              auVar126._8_56_ = auVar224;
            }
            else {
              local_4d8 = auVar130._0_16_;
              auVar224 = ZEXT856(extraout_var._4_8_);
              auVar15._8_4_ = 0x80000000;
              auVar15._0_8_ = 0x8000000080000000;
              auVar15._12_4_ = 0x80000000;
              auVar47 = vxorps_avx512vl(local_4d8,auVar15);
              auVar137 = ZEXT856(auVar47._8_8_);
              SVar255 = SampledSpectrum::operator*(&sigma_a,auVar47._0_4_);
              auVar217._0_8_ = SVar255.values.values._8_8_;
              auVar217._8_56_ = auVar224;
              auVar131._0_8_ = SVar255.values.values._0_8_;
              auVar131._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar131._0_16_,auVar217._0_16_);
              uVar136 = auVar47._8_8_;
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              SVar255 = FastExp((SampledSpectrum *)local_328);
              auVar218._0_8_ = SVar255.values.values._8_8_;
              auVar218._8_56_ = auVar224;
              local_5f8._8_8_ = uVar136;
              local_5f8._0_8_ = SVar255.values.values._0_8_;
              local_5d8 = auVar218._0_16_;
              local_548 = (float)this_01[3].lambda_max;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = DenselySampledSpectrum::Sample(this_01 + 2,lambda);
              auVar219._0_8_ = SVar255.values.values._8_8_;
              auVar219._8_56_ = auVar224;
              auVar132._0_8_ = SVar255.values.values._0_8_;
              auVar132._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar132._0_16_,auVar219._0_16_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              uVar136 = 0;
              SVar255 = SampledSpectrum::operator*((SampledSpectrum *)local_328,local_548);
              auVar220._0_8_ = SVar255.values.values._8_8_;
              auVar220._8_56_ = auVar224;
              local_548 = SVar255.values.values[0];
              fStack_544 = SVar255.values.values[1];
              auVar137 = ZEXT856(extraout_var._4_8_);
              uStack_540 = uVar136;
              PVar253 = Ray::operator()((Ray *)&bs,auVar130._0_4_);
              SVar255 = TmajAccum;
              auVar139._0_4_ = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
              auVar133._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar133._8_56_ = auVar137;
              auVar47 = vshufps_avx(auVar133._0_16_,auVar133._0_16_,0x50);
              auVar18._8_4_ = sigma_a_3.values.values[2];
              auVar18._0_4_ = sigma_a_3.values.values[0];
              auVar18._4_4_ = sigma_a_3.values.values[1];
              auVar18._12_4_ = sigma_a_3.values.values[3];
              auVar139._4_4_ = auVar139._0_4_;
              auVar139._8_4_ = auVar139._0_4_;
              auVar139._12_4_ = auVar139._0_4_;
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                   (float)(uVar12 | 0x10000);
              local_310._60_4_ = (uint)((ulong)&this_01[3].values >> 0x20) | 0x10000;
              local_310.ei.field_0 =
                   (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)TmajAccum.values.values._0_8_;
              local_310.mi.sigma_a.values.values[0] = TmajAccum.values.values[2];
              local_310.mi.sigma_a.values.values[1] = TmajAccum.values.values[3];
              auVar230._0_8_ =
                   CONCAT44(bs.optionalValue._16_4_,bs.optionalValue._12_4_) ^ 0x8000000080000000;
              auVar230._8_4_ = 0x80000000;
              auVar230._12_4_ = 0x80000000;
              local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = -(float)bs.optionalValue._20_4_;
              in_ZMM4 = ZEXT464((uint)bs.optionalValue._24_4_);
              local_310._96_16_ = (undefined1  [16])sigma_a.values.values;
              local_310._16_16_ = ZEXT816(0) << 0x20;
              local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              auVar17._4_4_ = fStack_544;
              auVar17._0_4_ = local_548;
              auVar17._8_8_ = uStack_540;
              uVar136 = vmovlps_avx(auVar139);
              local_328._16_4_ = (undefined4)uVar136;
              local_328._20_4_ = (undefined4)((ulong)uVar136 >> 0x20);
              local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)bs.optionalValue._24_4_;
              uVar136 = vmovlps_avx(auVar230);
              local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar136;
              local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar136 >> 0x20);
              local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
              local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                   SUB84(&this_01[3].values,0);
              local_310._64_4_ = sigma_a_3.values.values[0];
              local_310._68_12_ = auVar18._4_12_;
              local_310._112_16_ = vunpcklpd_avx(auVar17,auVar220._0_16_);
              local_310._128_16_ = vunpcklpd_avx(local_5f8,local_5d8);
              TmajAccum = SVar255;
              local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar23;
              RandomWalk::anon_class_88_11_14aa307c::operator()
                        ((anon_class_88_11_14aa307c *)&bsdf,(MediumSample *)local_328);
              SampledSpectrum::SampledSpectrum((SampledSpectrum *)&local_590,1.0);
              auVar126 = ZEXT864((ulong)local_590.o.super_Tuple3<pbrt::Point3,_float>._0_8_);
              auVar138._4_4_ = local_590.d.super_Tuple3<pbrt::Vector3,_float>.x;
              auVar138._0_4_ = local_590.o.super_Tuple3<pbrt::Point3,_float>.z;
              auVar138._8_8_ = 0;
            }
          }
          else {
            auVar14._8_4_ = 0x80000000;
            auVar14._0_8_ = 0x8000000080000000;
            auVar14._12_4_ = 0x80000000;
            auVar47 = vxorps_avx512vl(local_5f8,auVar14);
            auVar137 = ZEXT856(auVar47._8_8_);
            SVar255 = SampledSpectrum::operator*(&sigma_a,auVar47._0_4_);
            auVar164._0_8_ = SVar255.values.values._8_8_;
            auVar164._8_56_ = auVar224;
            auVar80._0_8_ = SVar255.values.values._0_8_;
            auVar80._8_56_ = auVar137;
            auVar47 = vmovlhps_avx(auVar80._0_16_,auVar164._0_16_);
            auVar137 = ZEXT856(auVar47._8_8_);
            local_328._0_8_ = auVar47._0_8_;
            local_328._8_4_ = auVar47._8_4_;
            local_328._12_4_ = auVar47._12_4_;
            SVar255 = FastExp((SampledSpectrum *)local_328);
            auVar165._0_8_ = SVar255.values.values._8_8_;
            auVar165._8_56_ = auVar224;
            auVar138 = auVar165._0_16_;
            auVar126._0_8_ = SVar255.values.values._0_8_;
            auVar126._8_56_ = auVar137;
          }
        }
        else {
          this = (Transform *)(this_01 + 3);
          if ((uVar36 & 0xfffe000000000000) == 0x2000000000000) {
            bsdf._16_8_ = &beta_local;
            sigma_a_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
            sigma_a_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
            uVar136 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar234._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
            auVar234._12_4_ = (ray->super_Ray).time;
            auVar224 = ZEXT856(auVar234._8_8_);
            sigma_a_3.values.values[2] = (float)uVar136;
            sigma_a_3.values.values[3] = (float)((ulong)uVar136 >> 0x20);
            bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &terminated;
            bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &pdfFwd;
            bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._4_8_ = &bounces;
            local_5e4 = (float)local_5f8._0_4_;
            SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
            Transform::ApplyInverse((Ray *)&bs,this,(Ray *)&sigma_a_3,&local_5e4);
            tVar49 = Length<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            local_5e4 = tVar49 * local_5e4;
            auVar137 = (undefined1  [56])0x0;
            VVar252 = Normalize<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            bs.optionalValue._20_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar65._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar65._8_56_ = auVar137;
            uVar136 = vmovlps_avx(auVar65._0_16_);
            bs.optionalValue._12_4_ = (undefined4)uVar136;
            bs.optionalValue._16_4_ = (undefined4)((ulong)uVar136 >> 0x20);
            pvVar1 = &this_01->values;
            bVar27 = Bounds3<float>::IntersectP
                               ((Bounds3<float> *)pvVar1,(Point3f *)&bs,
                                (Vector3f *)((long)&bs.optionalValue + 0xc),local_5e4,&tMin,&tMax);
            auVar251 = in_ZMM7._4_12_;
            auVar236 = in_ZMM4._4_12_;
            if (bVar27) {
              auVar137 = (undefined1  [56])0x0;
              local_5f8._0_4_ = *(Float *)&this_01[2].values.nStored;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
              auVar153._0_8_ = SVar255.values.values._8_8_;
              auVar153._8_56_ = auVar224;
              auVar66._0_8_ = SVar255.values.values._0_8_;
              auVar66._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar66._0_16_,auVar153._0_16_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar154._0_8_ = SVar255.values.values._8_8_;
              auVar154._8_56_ = auVar224;
              auVar67._0_8_ = SVar255.values.values._0_8_;
              auVar67._8_56_ = auVar137;
              sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar67._0_16_,auVar154._0_16_);
              local_5f8._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
              auVar155._0_8_ = SVar255.values.values._8_8_;
              auVar155._8_56_ = auVar224;
              auVar68._0_8_ = SVar255.values.values._0_8_;
              auVar68._8_56_ = auVar137;
              auVar47 = vmovlhps_avx(auVar68._0_16_,auVar155._0_16_);
              local_328._0_8_ = auVar47._0_8_;
              local_328._8_4_ = auVar47._8_4_;
              local_328._12_4_ = auVar47._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar156._0_8_ = SVar255.values.values._8_8_;
              auVar156._8_56_ = auVar224;
              auVar69._0_8_ = SVar255.values.values._0_8_;
              auVar69._8_56_ = auVar137;
              sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar69._0_16_,auVar156._0_16_);
              auVar137 = ZEXT856(sigma_s.values.values._8_8_);
              SVar255 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
              auVar157._0_8_ = SVar255.values.values._8_8_;
              auVar157._8_56_ = auVar224;
              auVar70._0_8_ = SVar255.values.values._0_8_;
              auVar70._8_56_ = auVar137;
              sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar70._0_16_,auVar157._0_16_);
              auVar137 = ZEXT856(sigma_t.values.values._8_8_);
              VVar252 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
              auVar223 = auVar157._4_60_;
              local_5f8._0_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar71._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar71._8_56_ = auVar137;
              local_5d8 = auVar71._0_16_;
              VVar252 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&bs);
              local_590.o.super_Tuple3<pbrt::Point3,_float>.z =
                   VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar72._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar72._8_56_ = auVar137;
              auVar226._4_4_ = bs.optionalValue._16_4_;
              auVar226._0_4_ = bs.optionalValue._12_4_;
              auVar226._8_8_ = 0;
              local_590.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar72._0_16_);
              auVar137 = (undefined1  [56])0x0;
              auVar47 = vdivps_avx(auVar226,local_5d8);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.z =
                   (float)bs.optionalValue._20_4_ / (float)local_5f8._0_4_;
              uVar136 = vmovlps_avx(auVar47);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar136;
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar136 >> 0x20);
              local_590.time = 0.0;
              local_590.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )0;
              PVar253 = Ray::operator()(&local_590,tMin);
              uVar23 = local_310._60_4_;
              uVar22 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              auVar158._0_4_ = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
              auVar158._4_60_ = auVar223;
              auVar73._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar73._8_56_ = auVar137;
              piVar3 = &this_01[7].lambda_max;
              uVar12 = this_01[7].lambda_min;
              uVar36 = CONCAT44(0,uVar12);
              auVar227 = vmovshdup_avx(auVar73._0_16_);
              auVar240 = ZEXT816(0) << 0x40;
              pDVar4 = this_01 + 7;
              lVar40 = 0;
              iVar28 = this_01[7].lambda_max;
              local_5d8._0_8_ = uVar36;
              fVar232 = (float)iVar28;
              auVar239._0_4_ = (float)(iVar28 + -1);
              auVar239._4_12_ = auVar236;
              auVar246._0_4_ = (float)(int)(uVar12 - 1);
              auVar246._4_12_ = auVar236;
              iVar37 = *(int *)&this_01[7].values.alloc.memoryResource;
              auVar235 = ZEXT416((uint)(auVar227._0_4_ * fVar232));
              auVar47 = vminss_avx(auVar239,auVar235);
              uVar136 = vcmpss_avx512f(auVar235,auVar240,1);
              fVar233 = (float)(int)uVar12;
              in_ZMM4 = ZEXT1664(CONCAT124(auVar251,fVar233));
              iVar38 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              auVar235 = ZEXT416((uint)(PVar253.super_Tuple3<pbrt::Point3,_float>.x * fVar233));
              auVar47 = vminss_avx(auVar246,auVar235);
              uVar136 = vcmpss_avx512f(auVar235,auVar240,1);
              fVar237 = (float)iVar37;
              auVar250._0_4_ = (float)(iVar37 + -1);
              auVar250._4_12_ = auVar251;
              iVar37 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              auVar47 = vminss_avx(auVar250,ZEXT416((uint)(auVar158._0_4_ * fVar237)));
              uVar136 = vcmpss_avx512f(ZEXT416((uint)(auVar158._0_4_ * fVar237)),auVar240,1);
              iVar44 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar47._0_4_);
              in_ZMM7 = ZEXT464((uint)tMin);
              local_5f8._0_4_ = tMin;
              for (; lVar40 != 3; lVar40 = lVar40 + 1) {
                iVar39 = (int)lVar40;
                if (iVar39 == 1) {
                  voxel[1] = iVar38;
                  piVar41 = voxelLimit + 1;
                  piVar42 = step + 1;
                  pFVar46 = deltaT + 1;
                  pfVar43 = nextCrossingT + 1;
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                  iVar45 = iVar38;
                }
                else {
                  pVVar33 = &local_590.d;
                  if (iVar39 == 0) {
                    voxel[lVar40] = iVar37;
                    piVar41 = voxelLimit;
                    piVar42 = step;
                    pFVar46 = deltaT;
                    pfVar43 = nextCrossingT;
                    iVar45 = iVar37;
                  }
                  else {
                    piVar41 = voxelLimit + 2;
                    piVar42 = step + 2;
                    pFVar46 = deltaT + 2;
                    pfVar43 = nextCrossingT + 2;
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    voxel[lVar40] = iVar44;
                    iVar45 = iVar44;
                  }
                }
                pVVar35 = &local_590.d;
                fVar244 = (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x;
                if ((fVar244 == 0.0) && (!NAN(fVar244))) {
                  pVVar33 = pVVar35;
                  if ((iVar39 != 0) &&
                     (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     iVar39 != 1)) {
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                  }
                  (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x = 0.0;
                }
                pVVar33 = pVVar35;
                if ((iVar39 != 0) &&
                   (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                   iVar39 != 1)) {
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                }
                if (0.0 <= (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x) {
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  fVar248 = PVar253.super_Tuple3<pbrt::Point3,_float>.x;
                  if ((iVar39 != 0) &&
                     (pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     pDVar34 = (DenselySampledSpectrum *)piVar3, fVar244 = fVar232,
                     fVar248 = auVar227._0_4_, iVar39 != 1)) {
                    pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                    fVar244 = fVar237;
                    fVar248 = auVar158._0_4_;
                  }
                  *piVar42 = 1;
                  fVar5 = (pVVar35->super_Tuple3<pbrt::Vector3,_float>).x;
                  fVar248 = ((float)(iVar45 + 1) / fVar244 - fVar248) / fVar5 + tMin;
                  in_ZMM7 = ZEXT464((uint)fVar248);
                  *pfVar43 = fVar248;
                  *pFVar46 = 1.0 / (fVar5 * fVar244);
                  iVar39 = pDVar34->lambda_min;
                }
                else {
                  in_ZMM7 = ZEXT1664(auVar73._0_16_);
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  if (iVar39 != 0) {
                    pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    in_ZMM7 = ZEXT1664(auVar227);
                    pDVar34 = (DenselySampledSpectrum *)piVar3;
                    fVar244 = fVar232;
                    if (iVar39 != 1) {
                      pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      in_ZMM7 = ZEXT1664(auVar158._0_16_);
                      pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                      fVar244 = fVar237;
                    }
                  }
                  fVar248 = (pVVar35->super_Tuple3<pbrt::Vector3,_float>).x;
                  *pfVar43 = ((float)iVar45 / fVar244 - in_ZMM7._0_4_) / fVar248 + tMin;
                  iVar39 = pDVar34->lambda_min;
                  *piVar42 = -1;
                  *pFVar46 = -1.0 / (fVar248 * (float)iVar39);
                  iVar39 = -1;
                }
                *piVar41 = iVar39;
              }
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                   (float)(uVar26 | 0x30000);
              uVar25 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              puVar2 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
              local_310._60_4_ = (uint)((ulong)puVar2 >> 0x20) | 0x10000;
              uVar26 = local_310._60_4_;
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar22;
              local_310._60_4_ = uVar23;
              while( true ) {
                iVar37 = *(int *)(&DAT_0053dd60 +
                                 (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                        (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                        (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                fVar232 = nextCrossingT[iVar37];
                auVar224 = (undefined1  [56])0x0;
                auVar47 = vminss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)tMax));
                local_548 = auVar47._0_4_;
                auVar137 = (undefined1  [56])0x0;
                SVar255 = SampledSpectrum::operator*
                                    (&sigma_t,this_01[6].values.ptr
                                              [(long)((iVar28 * voxel[2] + voxel[1]) * (int)uVar36)
                                               + (long)voxel[0]]);
                auVar186._0_8_ = SVar255.values.values._8_8_;
                auVar186._8_56_ = auVar224;
                auVar102._0_8_ = SVar255.values.values._0_8_;
                auVar102._8_56_ = auVar137;
                auVar231 = ZEXT1664(auVar102._0_16_);
                sigma_maj.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar102._0_16_,auVar186._0_16_);
                auVar137 = ZEXT856(sigma_maj.values.values._8_8_);
                if ((SVar255.values.values[0] != 0.0) || (NAN(SVar255.values.values[0]))) {
                  while( true ) {
                    FVar48 = SampleExponential((Float)local_4d8._0_4_,auVar231._0_4_);
                    local_5d8._0_4_ = FVar48;
                    fVar233 = RNG::Uniform<float>(&rng);
                    auVar47 = in_ZMM7._0_16_;
                    local_4d8._0_4_ = fVar233;
                    auVar137 = (undefined1  [56])0x0;
                    fVar233 = (float)local_5d8._0_4_ + (float)local_5f8._0_4_;
                    auVar224 = (undefined1  [56])0x0;
                    if (local_548 <= fVar233) break;
                    auVar137 = (undefined1  [56])0x0;
                    if (fVar233 < tMax) {
                      local_5d8._0_4_ = fVar233;
                      SVar255 = SampledSpectrum::operator-(&sigma_maj);
                      auVar190._0_8_ = SVar255.values.values._8_8_;
                      auVar190._8_56_ = auVar224;
                      auVar106._0_8_ = SVar255.values.values._0_8_;
                      auVar106._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar106._0_16_,auVar190._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      SVar255 = SampledSpectrum::operator*
                                          (&d,(float)local_5d8._0_4_ - (float)local_5f8._0_4_);
                      auVar191._0_8_ = SVar255.values.values._8_8_;
                      auVar191._8_56_ = auVar224;
                      auVar107._0_8_ = SVar255.values.values._0_8_;
                      auVar107._8_56_ = auVar137;
                      auVar227 = vmovlhps_avx(auVar107._0_16_,auVar191._0_16_);
                      auVar137 = ZEXT856(auVar227._8_8_);
                      local_328._0_8_ = auVar227._0_8_;
                      local_328._8_4_ = auVar227._8_4_;
                      local_328._12_4_ = auVar227._12_4_;
                      SVar255 = FastExp((SampledSpectrum *)local_328);
                      auVar192._0_8_ = SVar255.values.values._8_8_;
                      auVar192._8_56_ = auVar224;
                      auVar108._0_8_ = SVar255.values.values._0_8_;
                      auVar108._8_56_ = auVar137;
                      Tmaj_1.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar108._0_16_,auVar192._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      PVar253 = Ray::operator()((Ray *)&bs,(Float)local_5d8._0_4_);
                      local_558.z = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar109._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      auVar109._8_56_ = auVar137;
                      local_558._0_8_ = vmovlps_avx(auVar109._0_16_);
                      SVar255 = CloudMediumProvider::Density
                                          (*(CloudMediumProvider **)this_01,PVar253,lambda);
                      auVar193._0_8_ = SVar255.values.values._8_8_;
                      auVar193._8_56_ = auVar224;
                      auVar110._0_8_ = SVar255.values.values._0_8_;
                      auVar110._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar110._0_16_,auVar193._0_16_);
                      PVar253.super_Tuple3<pbrt::Point3,_float>.z = local_558.z;
                      PVar253.super_Tuple3<pbrt::Point3,_float>.x = local_558.x;
                      PVar253.super_Tuple3<pbrt::Point3,_float>.y = local_558.y;
                      auVar137 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                      uVar135 = 0;
                      SVar255 = CloudMediumProvider::Le
                                          (*(CloudMediumProvider **)this_01,PVar253,lambda);
                      auVar194._0_8_ = SVar255.values.values._8_8_;
                      auVar194._8_56_ = auVar137;
                      local_5f8._8_8_ = uVar135;
                      local_5f8._0_8_ = SVar255.values.values._0_8_;
                      SVar256 = SampledSpectrum::operator*(&sigma_a,&d);
                      auVar195._0_8_ = SVar256.values.values._8_8_;
                      auVar195._8_56_ = auVar137;
                      auVar137 = ZEXT856(auVar137._0_8_);
                      local_368._8_8_ = uVar135;
                      SVar255 = SampledSpectrum::operator*(&sigma_s,&d);
                      auVar196._0_8_ = SVar255.values.values._8_8_;
                      auVar196._8_56_ = auVar137;
                      local_368._0_8_ = SVar255.values.values._0_8_;
                      SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                      SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
                      uVar36 = CONCAT44(local_328._12_4_,local_328._8_4_);
                      TmajAccum.values.values[2] = (float)local_328._8_4_;
                      TmajAccum.values.values[3] = (float)local_328._12_4_;
                      TmajAccum.values.values[0] = (float)local_328._0_4_;
                      TmajAccum.values.values[1] = (float)local_328._4_4_;
                      PVar254 = Transform::operator()(this,(Point3<float> *)&local_558);
                      fVar233 = PVar254.super_Tuple3<pbrt::Point3,_float>.z;
                      local_388._8_8_ = uVar36;
                      local_388._0_8_ = PVar254.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      VVar252 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                      auVar235 = local_310._128_16_;
                      SVar255 = Tmaj_1;
                      auVar229._8_4_ = 0x80000000;
                      auVar229._0_8_ = 0x8000000080000000;
                      auVar229._12_4_ = 0x80000000;
                      auVar242._4_4_ = fVar233;
                      auVar242._0_4_ = fVar233;
                      auVar242._8_4_ = fVar233;
                      auVar242._12_4_ = fVar233;
                      local_310._96_16_ = (undefined1  [16])sigma_maj.values.values;
                      local_310._16_16_ = ZEXT816(0);
                      auVar51._0_8_ =
                           VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar51._8_8_ = uVar36 ^ auVar229._8_8_;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
                           -VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar227 = vpermilps_avx(local_388,0x50);
                      local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                      local_328._0_8_ = auVar227._0_8_;
                      local_328._8_4_ = auVar227._8_4_;
                      local_328._12_4_ = auVar227._12_4_;
                      uVar136 = vmovlps_avx(auVar242);
                      local_328._16_4_ = (undefined4)uVar136;
                      local_328._20_4_ = (undefined4)((ulong)uVar136 >> 0x20);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)auVar234._12_4_;
                      uVar136 = vmovlpd_avx(auVar51);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar136;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                           (Float)((ulong)uVar136 >> 0x20);
                      auVar54._16_16_ = auVar196._0_16_;
                      auVar54._0_16_ = auVar51;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                           SUB84(puVar2,0);
                      auVar142._16_16_ = auVar195._0_16_;
                      auVar142._0_16_ = auVar51;
                      auVar55 = vperm2f128_avx(auVar142,auVar54,0x31);
                      auVar143._8_8_ = uVar135;
                      auVar143._0_8_ = SVar256.values.values._0_8_;
                      auVar143._16_16_ = local_368;
                      auVar55 = vunpcklpd_avx(auVar143,auVar55);
                      local_310._64_4_ = auVar55._0_4_;
                      local_310._68_12_ = auVar55._4_12_;
                      local_310.ei.field_0 = auVar55._16_8_;
                      local_310._88_8_ = auVar55._24_8_;
                      local_310._112_16_ = vunpcklpd_avx(local_5f8,auVar194._0_16_);
                      local_310.mi.sigma_maj.values.values[2] = Tmaj_1.values.values[0];
                      local_310.mi.sigma_maj.values.values[3] = Tmaj_1.values.values[1];
                      local_310._128_16_ = auVar235;
                      in_ZMM4 = ZEXT1664(auVar227);
                      in_ZMM7 = ZEXT1664(auVar47);
                      Tmaj_1 = SVar255;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                           (float)uVar24;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                           (float)uVar25;
                      local_310._60_4_ = uVar26;
                      bVar27 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                         ((anon_class_88_11_14aa307c *)&bsdf,
                                          (MediumSample *)local_328);
                      if (!bVar27) goto LAB_0041dfd1;
                      fVar233 = (float)local_5d8._0_4_;
                    }
                    auVar231 = ZEXT464((uint)sigma_maj.values.values[0]);
                    local_5f8._0_4_ = fVar233;
                  }
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar197._0_8_ = SVar255.values.values._8_8_;
                  auVar197._8_56_ = auVar224;
                  auVar111._0_8_ = SVar255.values.values._0_8_;
                  auVar111._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar111._0_16_,auVar197._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar198._0_8_ = SVar255.values.values._8_8_;
                  auVar198._8_56_ = auVar224;
                  auVar112._0_8_ = SVar255.values.values._0_8_;
                  auVar112._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar112._0_16_,auVar198._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar199._0_8_ = SVar255.values.values._8_8_;
                  auVar199._8_56_ = auVar224;
                  auVar227 = auVar199._0_16_;
                  auVar113._0_8_ = SVar255.values.values._0_8_;
                  auVar113._8_56_ = auVar137;
                  auVar47 = auVar113._0_16_;
                }
                else {
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar187._0_8_ = SVar255.values.values._8_8_;
                  auVar187._8_56_ = auVar224;
                  auVar103._0_8_ = SVar255.values.values._0_8_;
                  auVar103._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar103._0_16_,auVar187._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar188._0_8_ = SVar255.values.values._8_8_;
                  auVar188._8_56_ = auVar224;
                  auVar104._0_8_ = SVar255.values.values._0_8_;
                  auVar104._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar104._0_16_,auVar188._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar189._0_8_ = SVar255.values.values._8_8_;
                  auVar189._8_56_ = auVar224;
                  auVar227 = auVar189._0_16_;
                  auVar105._0_8_ = SVar255.values.values._0_8_;
                  auVar105._8_56_ = auVar137;
                  auVar47 = auVar105._0_16_;
                }
                auVar47 = vmovlhps_avx(auVar47,auVar227);
                local_328._0_8_ = auVar47._0_8_;
                local_328._8_4_ = auVar47._8_4_;
                local_328._12_4_ = auVar47._12_4_;
                SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_328);
                if ((tMax < fVar232) ||
                   (iVar28 = voxel[iVar37], voxel[iVar37] = iVar28 + step[iVar37],
                   iVar28 + step[iVar37] == voxelLimit[iVar37])) break;
                local_5f8._0_4_ = local_548;
                nextCrossingT[iVar37] = fVar232 + deltaT[iVar37];
                uVar36 = (ulong)(uint)pDVar4->lambda_min;
                iVar28 = *piVar3;
              }
LAB_0041dfd1:
              SVar255.values.values = TmajAccum.values.values;
              local_328._0_4_ = TmajAccum.values.values[0];
              local_328._4_4_ = TmajAccum.values.values[1];
              local_328._8_4_ = SVar255.values.values[2];
              local_328._12_4_ = SVar255.values.values[3];
              TmajAccum.values.values = SVar255.values.values;
            }
            else {
              SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
            }
          }
          else {
            bsdf._16_8_ = &beta_local;
            sigma_a_3.values.values[0] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
            sigma_a_3.values.values[1] = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
            uVar136 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
            auVar47._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).d;
            auVar47._12_4_ = (ray->super_Ray).time;
            auVar224 = ZEXT856(auVar47._8_8_);
            sigma_a_3.values.values[2] = (float)uVar136;
            sigma_a_3.values.values[3] = (float)((ulong)uVar136 >> 0x20);
            bsdf.ng.super_Tuple3<pbrt::Normal3,_float>._0_8_ = &terminated;
            bsdf.shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>._0_8_ = &pdfFwd;
            bsdf.shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>._4_8_ = &bounces;
            local_5e4 = (float)local_5f8._0_4_;
            SampledSpectrum::SampledSpectrum(&TmajAccum,1.0);
            Transform::ApplyInverse((Ray *)&bs,this,(Ray *)&sigma_a_3,&local_5e4);
            tVar49 = Length<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            local_5e4 = tVar49 * local_5e4;
            auVar137 = (undefined1  [56])0x0;
            VVar252 = Normalize<float>((Vector3<float> *)((long)&bs.optionalValue + 0xc));
            bs.optionalValue._20_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar81._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar81._8_56_ = auVar137;
            uVar136 = vmovlps_avx(auVar81._0_16_);
            bs.optionalValue._12_4_ = (undefined4)uVar136;
            bs.optionalValue._16_4_ = (undefined4)((ulong)uVar136 >> 0x20);
            pvVar1 = &this_01->values;
            bVar27 = Bounds3<float>::IntersectP
                               ((Bounds3<float> *)pvVar1,(Point3f *)&bs,
                                (Vector3f *)((long)&bs.optionalValue + 0xc),local_5e4,&tMin,&tMax);
            auVar251 = in_ZMM7._4_12_;
            auVar236 = in_ZMM4._4_12_;
            if (bVar27) {
              auVar137 = (undefined1  [56])0x0;
              local_5f8._0_4_ = *(Float *)&this_01[2].values.nStored;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&(this_01->values).nStored,lambda);
              auVar166._0_8_ = SVar255.values.values._8_8_;
              auVar166._8_56_ = auVar224;
              auVar82._0_8_ = SVar255.values.values._0_8_;
              auVar82._8_56_ = auVar137;
              auVar227 = vmovlhps_avx(auVar82._0_16_,auVar166._0_16_);
              local_328._0_8_ = auVar227._0_8_;
              local_328._8_4_ = auVar227._8_4_;
              local_328._12_4_ = auVar227._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar167._0_8_ = SVar255.values.values._8_8_;
              auVar167._8_56_ = auVar224;
              auVar83._0_8_ = SVar255.values.values._0_8_;
              auVar83._8_56_ = auVar137;
              sigma_a.values.values = (array<float,_4>)vmovlhps_avx(auVar83._0_16_,auVar167._0_16_);
              local_5f8._0_4_ = *(undefined4 *)&this_01[2].values.nStored;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)&this_01[1].values.nStored,lambda);
              auVar168._0_8_ = SVar255.values.values._8_8_;
              auVar168._8_56_ = auVar224;
              auVar84._0_8_ = SVar255.values.values._0_8_;
              auVar84._8_56_ = auVar137;
              auVar227 = vmovlhps_avx(auVar84._0_16_,auVar168._0_16_);
              local_328._0_8_ = auVar227._0_8_;
              local_328._8_4_ = auVar227._8_4_;
              local_328._12_4_ = auVar227._12_4_;
              auVar137 = (undefined1  [56])0x0;
              SVar255 = SampledSpectrum::operator*
                                  ((SampledSpectrum *)local_328,(Float)local_5f8._0_4_);
              auVar169._0_8_ = SVar255.values.values._8_8_;
              auVar169._8_56_ = auVar224;
              auVar85._0_8_ = SVar255.values.values._0_8_;
              auVar85._8_56_ = auVar137;
              sigma_s.values.values = (array<float,_4>)vmovlhps_avx(auVar85._0_16_,auVar169._0_16_);
              auVar137 = ZEXT856(sigma_s.values.values._8_8_);
              SVar255 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
              auVar170._0_8_ = SVar255.values.values._8_8_;
              auVar170._8_56_ = auVar224;
              auVar86._0_8_ = SVar255.values.values._0_8_;
              auVar86._8_56_ = auVar137;
              sigma_t.values.values = (array<float,_4>)vmovlhps_avx(auVar86._0_16_,auVar170._0_16_);
              auVar137 = ZEXT856(sigma_t.values.values._8_8_);
              VVar252 = Bounds3<float>::Diagonal((Bounds3<float> *)pvVar1);
              auVar223 = auVar170._4_60_;
              local_5f8._0_4_ = VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar87._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar87._8_56_ = auVar137;
              local_5d8 = auVar87._0_16_;
              VVar252 = Bounds3<float>::Offset((Bounds3<float> *)pvVar1,(Point3<float> *)&bs);
              local_590.o.super_Tuple3<pbrt::Point3,_float>.z =
                   VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar88._0_8_ = VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar88._8_56_ = auVar137;
              auVar227._4_4_ = bs.optionalValue._16_4_;
              auVar227._0_4_ = bs.optionalValue._12_4_;
              auVar227._8_8_ = 0;
              local_590.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar88._0_16_);
              auVar137 = (undefined1  [56])0x0;
              auVar227 = vdivps_avx(auVar227,local_5d8);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.z =
                   (float)bs.optionalValue._20_4_ / (float)local_5f8._0_4_;
              uVar136 = vmovlps_avx(auVar227);
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar136;
              local_590.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar136 >> 0x20);
              local_590.time = 0.0;
              local_590.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )0;
              PVar253 = Ray::operator()(&local_590,tMin);
              uVar24 = local_310._60_4_;
              uVar22 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              auVar171._0_4_ = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
              auVar171._4_60_ = auVar223;
              auVar89._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
              auVar89._8_56_ = auVar137;
              piVar3 = &this_01[7].lambda_max;
              uVar13 = this_01[7].lambda_min;
              uVar36 = CONCAT44(0,uVar13);
              auVar234 = vmovshdup_avx(auVar89._0_16_);
              auVar52 = ZEXT816(0) << 0x40;
              pDVar4 = this_01 + 7;
              lVar40 = 0;
              iVar28 = this_01[7].lambda_max;
              local_5d8._0_8_ = uVar36;
              fVar232 = (float)iVar28;
              auVar240._0_4_ = (float)(iVar28 + -1);
              auVar240._4_12_ = auVar236;
              auVar247._0_4_ = (float)(int)(uVar13 - 1);
              auVar247._4_12_ = auVar236;
              iVar37 = *(int *)&this_01[7].values.alloc.memoryResource;
              auVar235 = ZEXT416((uint)(auVar234._0_4_ * fVar232));
              auVar227 = vminss_avx(auVar240,auVar235);
              uVar136 = vcmpss_avx512f(auVar235,auVar52,1);
              fVar233 = (float)(int)uVar13;
              in_ZMM4 = ZEXT1664(CONCAT124(auVar251,fVar233));
              iVar38 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar227._0_4_);
              auVar235 = ZEXT416((uint)(PVar253.super_Tuple3<pbrt::Point3,_float>.x * fVar233));
              auVar227 = vminss_avx(auVar247,auVar235);
              uVar136 = vcmpss_avx512f(auVar235,auVar52,1);
              fVar237 = (float)iVar37;
              auVar235._0_4_ = (float)(iVar37 + -1);
              auVar235._4_12_ = auVar251;
              iVar37 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar227._0_4_);
              auVar227 = vminss_avx(auVar235,ZEXT416((uint)(auVar171._0_4_ * fVar237)));
              uVar136 = vcmpss_avx512f(ZEXT416((uint)(auVar171._0_4_ * fVar237)),auVar52,1);
              iVar44 = (int)(float)((uint)!(bool)((byte)uVar136 & 1) * auVar227._0_4_);
              in_ZMM7 = ZEXT464((uint)tMin);
              local_5f8._0_4_ = tMin;
              for (; lVar40 != 3; lVar40 = lVar40 + 1) {
                iVar39 = (int)lVar40;
                if (iVar39 == 1) {
                  voxel[1] = iVar38;
                  piVar41 = voxelLimit + 1;
                  piVar42 = step + 1;
                  pFVar46 = deltaT + 1;
                  pfVar43 = nextCrossingT + 1;
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                  iVar45 = iVar38;
                }
                else {
                  pVVar33 = &local_590.d;
                  if (iVar39 == 0) {
                    voxel[lVar40] = iVar37;
                    piVar41 = voxelLimit;
                    piVar42 = step;
                    pFVar46 = deltaT;
                    pfVar43 = nextCrossingT;
                    iVar45 = iVar37;
                  }
                  else {
                    piVar41 = voxelLimit + 2;
                    piVar42 = step + 2;
                    pFVar46 = deltaT + 2;
                    pfVar43 = nextCrossingT + 2;
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    voxel[lVar40] = iVar44;
                    iVar45 = iVar44;
                  }
                }
                pVVar35 = &local_590.d;
                fVar244 = (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x;
                if ((fVar244 == 0.0) && (!NAN(fVar244))) {
                  pVVar33 = pVVar35;
                  if ((iVar39 != 0) &&
                     (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     iVar39 != 1)) {
                    pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                  }
                  (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x = 0.0;
                }
                pVVar33 = pVVar35;
                if ((iVar39 != 0) &&
                   (pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                   iVar39 != 1)) {
                  pVVar33 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                }
                if (0.0 <= (pVVar33->super_Tuple3<pbrt::Vector3,_float>).x) {
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  fVar248 = PVar253.super_Tuple3<pbrt::Point3,_float>.x;
                  if ((iVar39 != 0) &&
                     (pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y,
                     pDVar34 = (DenselySampledSpectrum *)piVar3, fVar244 = fVar232,
                     fVar248 = auVar234._0_4_, iVar39 != 1)) {
                    pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                    pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                    fVar244 = fVar237;
                    fVar248 = auVar171._0_4_;
                  }
                  *piVar42 = 1;
                  fVar5 = (pVVar35->super_Tuple3<pbrt::Vector3,_float>).x;
                  fVar248 = ((float)(iVar45 + 1) / fVar244 - fVar248) / fVar5 + tMin;
                  in_ZMM7 = ZEXT464((uint)fVar248);
                  *pfVar43 = fVar248;
                  *pFVar46 = 1.0 / (fVar5 * fVar244);
                  iVar39 = pDVar34->lambda_min;
                }
                else {
                  in_ZMM7 = ZEXT1664(auVar89._0_16_);
                  pDVar34 = pDVar4;
                  fVar244 = fVar233;
                  if (iVar39 != 0) {
                    pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.y;
                    in_ZMM7 = ZEXT1664(auVar234);
                    pDVar34 = (DenselySampledSpectrum *)piVar3;
                    fVar244 = fVar232;
                    if (iVar39 != 1) {
                      pVVar35 = (Vector3f *)&local_590.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      in_ZMM7 = ZEXT1664(auVar171._0_16_);
                      pDVar34 = (DenselySampledSpectrum *)&this_01[7].values;
                      fVar244 = fVar237;
                    }
                  }
                  fVar248 = (pVVar35->super_Tuple3<pbrt::Vector3,_float>).x;
                  *pfVar43 = ((float)iVar45 / fVar244 - in_ZMM7._0_4_) / fVar248 + tMin;
                  iVar39 = pDVar34->lambda_min;
                  *piVar42 = -1;
                  *pFVar46 = -1.0 / (fVar248 * (float)iVar39);
                  iVar39 = -1;
                }
                *piVar41 = iVar39;
              }
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                   (float)(uVar12 | 0x40000);
              uVar25 = local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              puVar2 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
              local_310._60_4_ = (uint)((ulong)puVar2 >> 0x20) | 0x10000;
              uVar26 = local_310._60_4_;
              local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar22;
              local_310._60_4_ = uVar24;
              while( true ) {
                iVar37 = *(int *)(&DAT_0053dd60 +
                                 (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                        (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                        (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4);
                fVar232 = nextCrossingT[iVar37];
                auVar224 = (undefined1  [56])0x0;
                auVar227 = vminss_avx(ZEXT416((uint)fVar232),ZEXT416((uint)tMax));
                local_548 = auVar227._0_4_;
                auVar137 = (undefined1  [56])0x0;
                SVar255 = SampledSpectrum::operator*
                                    (&sigma_t,this_01[6].values.ptr
                                              [(long)((iVar28 * voxel[2] + voxel[1]) * (int)uVar36)
                                               + (long)voxel[0]]);
                auVar200._0_8_ = SVar255.values.values._8_8_;
                auVar200._8_56_ = auVar224;
                auVar114._0_8_ = SVar255.values.values._0_8_;
                auVar114._8_56_ = auVar137;
                auVar231 = ZEXT1664(auVar114._0_16_);
                sigma_maj.values.values =
                     (array<float,_4>)vmovlhps_avx(auVar114._0_16_,auVar200._0_16_);
                auVar137 = ZEXT856(sigma_maj.values.values._8_8_);
                if ((SVar255.values.values[0] != 0.0) || (NAN(SVar255.values.values[0]))) {
                  while( true ) {
                    FVar48 = SampleExponential((Float)local_4d8._0_4_,auVar231._0_4_);
                    local_5d8._0_4_ = FVar48;
                    fVar233 = RNG::Uniform<float>(&rng);
                    auVar227 = in_ZMM7._0_16_;
                    local_4d8._0_4_ = fVar233;
                    auVar137 = (undefined1  [56])0x0;
                    fVar233 = (float)local_5d8._0_4_ + (float)local_5f8._0_4_;
                    auVar224 = (undefined1  [56])0x0;
                    if (local_548 <= fVar233) break;
                    auVar137 = (undefined1  [56])0x0;
                    if (fVar233 < tMax) {
                      local_5d8._0_4_ = fVar233;
                      SVar255 = SampledSpectrum::operator-(&sigma_maj);
                      auVar204._0_8_ = SVar255.values.values._8_8_;
                      auVar204._8_56_ = auVar224;
                      auVar118._0_8_ = SVar255.values.values._0_8_;
                      auVar118._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar118._0_16_,auVar204._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      SVar255 = SampledSpectrum::operator*
                                          (&d,(float)local_5d8._0_4_ - (float)local_5f8._0_4_);
                      auVar205._0_8_ = SVar255.values.values._8_8_;
                      auVar205._8_56_ = auVar224;
                      auVar119._0_8_ = SVar255.values.values._0_8_;
                      auVar119._8_56_ = auVar137;
                      auVar234 = vmovlhps_avx(auVar119._0_16_,auVar205._0_16_);
                      auVar137 = ZEXT856(auVar234._8_8_);
                      local_328._0_8_ = auVar234._0_8_;
                      local_328._8_4_ = auVar234._8_4_;
                      local_328._12_4_ = auVar234._12_4_;
                      SVar255 = FastExp((SampledSpectrum *)local_328);
                      auVar206._0_8_ = SVar255.values.values._8_8_;
                      auVar206._8_56_ = auVar224;
                      auVar120._0_8_ = SVar255.values.values._0_8_;
                      auVar120._8_56_ = auVar137;
                      Tmaj_1.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar120._0_16_,auVar206._0_16_);
                      auVar137 = (undefined1  [56])0x0;
                      PVar253 = Ray::operator()((Ray *)&bs,(Float)local_5d8._0_4_);
                      local_558.z = PVar253.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar121._0_8_ = PVar253.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      auVar121._8_56_ = auVar137;
                      local_558._0_8_ = vmovlps_avx(auVar121._0_16_);
                      SVar255 = NanoVDBMediumProvider::Density
                                          (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_558,
                                           lambda);
                      auVar207._0_8_ = SVar255.values.values._8_8_;
                      auVar207._8_56_ = auVar224;
                      auVar122._0_8_ = SVar255.values.values._0_8_;
                      auVar122._8_56_ = auVar137;
                      d.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar122._0_16_,auVar207._0_16_);
                      uVar135 = d.values.values._8_8_;
                      SVar255 = NanoVDBMediumProvider::Le
                                          (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_558,
                                           lambda);
                      auVar208._0_8_ = SVar255.values.values._8_8_;
                      auVar208._8_56_ = auVar224;
                      local_5f8._8_8_ = uVar135;
                      local_5f8._0_8_ = SVar255.values.values._0_8_;
                      SVar256 = SampledSpectrum::operator*(&sigma_a,&d);
                      auVar209._0_8_ = SVar256.values.values._8_8_;
                      auVar209._8_56_ = auVar224;
                      uStack_180 = auVar224._0_8_;
                      auVar137 = ZEXT856(uStack_180);
                      local_358._8_8_ = uVar135;
                      SVar255 = SampledSpectrum::operator*(&sigma_s,&d);
                      auVar210._0_8_ = SVar255.values.values._8_8_;
                      auVar210._8_56_ = auVar137;
                      local_358._0_8_ = SVar255.values.values._0_8_;
                      SampledSpectrum::operator*=(&Tmaj_1,&TmajAccum);
                      SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
                      uVar136 = CONCAT44(local_328._12_4_,local_328._8_4_);
                      TmajAccum.values.values[2] = (float)local_328._8_4_;
                      TmajAccum.values.values[3] = (float)local_328._12_4_;
                      TmajAccum.values.values[0] = (float)local_328._0_4_;
                      TmajAccum.values.values[1] = (float)local_328._4_4_;
                      PVar254 = Transform::operator()(this,(Point3<float> *)&local_558);
                      fVar233 = PVar254.super_Tuple3<pbrt::Point3,_float>.z;
                      local_378._8_8_ = uVar136;
                      local_378._0_8_ = PVar254.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      VVar252 = Normalize<float>((Vector3<float> *)(sigma_a_3.values.values + 3));
                      auVar235 = local_310._128_16_;
                      SVar255 = Tmaj_1;
                      auVar243._4_4_ = fVar233;
                      auVar243._0_4_ = fVar233;
                      auVar243._8_4_ = fVar233;
                      auVar243._12_4_ = fVar233;
                      local_310._96_16_ = (undefined1  [16])sigma_maj.values.values;
                      local_310._16_16_ = ZEXT816(0);
                      auVar52._0_8_ =
                           VVar252.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar52._8_4_ = (uint)uVar136 ^ 0x80000000;
                      auVar52._12_4_ = (uint)((ulong)uVar136 >> 0x20) ^ 0x80000000;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
                           -VVar252.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar234 = vpermilps_avx(local_378,0x50);
                      local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                      local_328._0_8_ = auVar234._0_8_;
                      local_328._8_4_ = auVar234._8_4_;
                      local_328._12_4_ = auVar234._12_4_;
                      uVar136 = vmovlps_avx(auVar243);
                      local_328._16_4_ = (undefined4)uVar136;
                      local_328._20_4_ = (undefined4)((ulong)uVar136 >> 0x20);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)auVar47._12_4_;
                      uVar136 = vmovlps_avx(auVar52);
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar136;
                      local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                           (Float)((ulong)uVar136 >> 0x20);
                      auVar55._16_16_ = auVar210._0_16_;
                      auVar55._0_16_ = auVar52;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                           SUB84(puVar2,0);
                      auVar144._16_16_ = auVar209._0_16_;
                      auVar144._0_16_ = auVar52;
                      auVar55 = vperm2f128_avx(auVar144,auVar55,0x31);
                      auVar145._8_8_ = uVar135;
                      auVar145._0_8_ = SVar256.values.values._0_8_;
                      auVar145._16_16_ = local_358;
                      auVar55 = vunpcklpd_avx(auVar145,auVar55);
                      local_310._64_4_ = auVar55._0_4_;
                      local_310._68_12_ = auVar55._4_12_;
                      local_310.ei.field_0 = auVar55._16_8_;
                      local_310._88_8_ = auVar55._24_8_;
                      local_310._112_16_ = vunpcklpd_avx(local_5f8,auVar208._0_16_);
                      local_310.mi.sigma_maj.values.values[2] = Tmaj_1.values.values[0];
                      local_310.mi.sigma_maj.values.values[3] = Tmaj_1.values.values[1];
                      local_310._128_16_ = auVar235;
                      in_ZMM4 = ZEXT1664(auVar234);
                      in_ZMM7 = ZEXT1664(auVar227);
                      Tmaj_1 = SVar255;
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                           (float)uVar23;
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                           (float)uVar25;
                      local_310._60_4_ = uVar26;
                      bVar27 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                         ((anon_class_88_11_14aa307c *)&bsdf,
                                          (MediumSample *)local_328);
                      if (!bVar27) goto LAB_0041dfd1;
                      fVar233 = (float)local_5d8._0_4_;
                    }
                    auVar231 = ZEXT464((uint)sigma_maj.values.values[0]);
                    local_5f8._0_4_ = fVar233;
                  }
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar211._0_8_ = SVar255.values.values._8_8_;
                  auVar211._8_56_ = auVar224;
                  auVar123._0_8_ = SVar255.values.values._0_8_;
                  auVar123._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar123._0_16_,auVar211._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar212._0_8_ = SVar255.values.values._8_8_;
                  auVar212._8_56_ = auVar224;
                  auVar124._0_8_ = SVar255.values.values._0_8_;
                  auVar124._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar124._0_16_,auVar212._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar213._0_8_ = SVar255.values.values._8_8_;
                  auVar213._8_56_ = auVar224;
                  auVar234 = auVar213._0_16_;
                  auVar125._0_8_ = SVar255.values.values._0_8_;
                  auVar125._8_56_ = auVar137;
                  auVar227 = auVar125._0_16_;
                }
                else {
                  SVar255 = SampledSpectrum::operator-(&sigma_maj);
                  auVar201._0_8_ = SVar255.values.values._8_8_;
                  auVar201._8_56_ = auVar224;
                  auVar115._0_8_ = SVar255.values.values._0_8_;
                  auVar115._8_56_ = auVar137;
                  d.values.values = (array<float,_4>)vmovlhps_avx(auVar115._0_16_,auVar201._0_16_);
                  auVar137 = (undefined1  [56])0x0;
                  SVar255 = SampledSpectrum::operator*(&d,local_548 - (float)local_5f8._0_4_);
                  auVar202._0_8_ = SVar255.values.values._8_8_;
                  auVar202._8_56_ = auVar224;
                  auVar116._0_8_ = SVar255.values.values._0_8_;
                  auVar116._8_56_ = auVar137;
                  Tmaj_1.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar116._0_16_,auVar202._0_16_);
                  auVar137 = ZEXT856(Tmaj_1.values.values._8_8_);
                  SVar255 = FastExp(&Tmaj_1);
                  auVar203._0_8_ = SVar255.values.values._8_8_;
                  auVar203._8_56_ = auVar224;
                  auVar234 = auVar203._0_16_;
                  auVar117._0_8_ = SVar255.values.values._0_8_;
                  auVar117._8_56_ = auVar137;
                  auVar227 = auVar117._0_16_;
                }
                auVar227 = vmovlhps_avx(auVar227,auVar234);
                local_328._0_8_ = auVar227._0_8_;
                local_328._8_4_ = auVar227._8_4_;
                local_328._12_4_ = auVar227._12_4_;
                SampledSpectrum::operator*=(&TmajAccum,(SampledSpectrum *)local_328);
                if ((tMax < fVar232) ||
                   (iVar28 = voxel[iVar37], voxel[iVar37] = iVar28 + step[iVar37],
                   iVar28 + step[iVar37] == voxelLimit[iVar37])) break;
                local_5f8._0_4_ = local_548;
                nextCrossingT[iVar37] = fVar232 + deltaT[iVar37];
                uVar36 = (ulong)(uint)pDVar4->lambda_min;
                iVar28 = *piVar3;
              }
              goto LAB_0041dfd1;
            }
            SampledSpectrum::SampledSpectrum((SampledSpectrum *)local_328,1.0);
          }
LAB_0041dfe3:
          auVar126 = ZEXT864((ulong)local_328._0_8_);
          auVar138._4_4_ = local_328._12_4_;
          auVar138._0_4_ = local_328._8_4_;
          auVar138._8_8_ = 0;
        }
        auVar137 = auVar126._8_56_;
        Tmaj.values.values = (array<float,_4>)vmovlhps_avx(auVar126._0_16_,auVar138);
        auVar224 = ZEXT856(Tmaj.values.values._8_8_);
        SVar255 = SampledSpectrum::operator/(&Tmaj,auVar126._0_4_);
        auVar214._0_8_ = SVar255.values.values._8_8_;
        auVar214._8_56_ = auVar224;
        auVar127._0_8_ = SVar255.values.values._0_8_;
        auVar127._8_56_ = auVar137;
        auVar47 = vmovlhps_avx(auVar127._0_16_,auVar214._0_16_);
        local_328._0_8_ = auVar47._0_8_;
        local_328._8_4_ = auVar47._8_4_;
        local_328._12_4_ = auVar47._12_4_;
        SampledSpectrum::operator*=(&beta_local,(SampledSpectrum *)local_328);
      }
      iVar28 = bounces;
      if (terminated == true) {
        pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
        return iVar28;
      }
      if (si.set == false) {
        if (mode == Radiance) {
          EndpointInteraction::EndpointInteraction((EndpointInteraction *)&bsdf,&ray->super_Ray);
          Vertex::CreateLight((Vertex *)local_328,(EndpointInteraction *)&bsdf,&beta_local,pdfFwd);
          memcpy(this_00,local_328,0x158);
          bounces = bounces + 1;
        }
        goto LAB_0041e6eb;
      }
      pSVar29 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      local_1a0.bits =
           (local_1c0->
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           ).bits;
      local_1a8 = (sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
      SurfaceInteraction::GetBSDF
                (&bsdf,&pSVar29->intr,ray,lambda,(CameraHandle *)&local_1a0,local_1b8,
                 (SamplerHandle)&local_1a8);
      auVar227 = in_ZMM7._0_16_;
      auVar47 = in_ZMM4._0_16_;
      if (((ulong)bsdf.bxdf.
                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                  .bits & 0xffffffffffff) == 0) {
        pSVar32 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
        SurfaceInteraction::SkipIntersection(&pSVar29->intr,ray,pSVar32->tHit);
      }
      else {
        if ((regularize) && (bVar21)) {
          *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
          TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
          ::Dispatch<pbrt::BxDFHandle::Regularize()::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::IdealDiffuseBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricInterfaceBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
                      *)&bsdf);
        }
        *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
        Vertex::CreateSurface((Vertex *)local_328,&pSVar29->intr,&bsdf,&beta_local,pdfFwd,prev);
        memcpy(this_00,(Vertex *)local_328,0x158);
        bounces = bounces + 1;
        if (maxDepth <= bounces) {
LAB_0041e6eb:
          pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
          return bounces;
        }
        uVar6 = (pSVar29->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar8 = (pSVar29->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        local_5f8._0_4_ = (pSVar29->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        FVar48 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
        local_5d8._0_4_ = FVar48;
        u2 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler);
        woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_5f8._0_4_;
        woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar6;
        woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar8;
        auVar137 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        BSDF::Sample_f(&bs,&bsdf,woRender,(Float)local_5d8._0_4_,u2,mode,All);
        if (bs.set == false) {
          pstd::optional<pbrt::BSDFSample>::~optional(&bs);
          goto LAB_0041e6eb;
        }
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        pdfFwd = pBVar30->pdf;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        bVar21 = (bool)(bVar21 | (pBVar30->flags & Specular) == Unset);
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        pBVar31 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        tVar49 = AbsDot<float>(&pBVar31->wi,&(pSVar29->intr).shading.n);
        auVar224 = extraout_var_00;
        SVar255 = SampledSpectrum::operator*(&pBVar30->f,tVar49);
        auVar215._0_8_ = SVar255.values.values._8_8_;
        auVar215._8_56_ = auVar137;
        auVar128._0_8_ = SVar255.values.values._0_8_;
        auVar128._8_56_ = auVar224;
        auVar234 = vmovlhps_avx(auVar128._0_16_,auVar215._0_16_);
        local_590.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar234._0_8_;
        local_590.o.super_Tuple3<pbrt::Point3,_float>.z = auVar234._8_4_;
        local_590.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar234._12_4_;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        auVar224 = (undefined1  [56])0x0;
        SVar255 = SampledSpectrum::operator/((SampledSpectrum *)&local_590,pBVar30->pdf);
        auVar216._0_8_ = SVar255.values.values._8_8_;
        auVar216._8_56_ = auVar137;
        auVar129._0_8_ = SVar255.values.values._0_8_;
        auVar129._8_56_ = auVar224;
        auVar234 = vmovlhps_avx(auVar129._0_16_,auVar216._0_16_);
        local_328._0_8_ = auVar234._0_8_;
        local_328._8_4_ = auVar234._8_4_;
        local_328._12_4_ = auVar234._12_4_;
        SampledSpectrum::operator*=(&beta_local,(SampledSpectrum *)local_328);
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        uVar7 = (pBVar30->wi).super_Tuple3<pbrt::Vector3,_float>.x;
        uVar9 = (pBVar30->wi).super_Tuple3<pbrt::Vector3,_float>.y;
        local_5d8._4_4_ = uVar9;
        local_5d8._0_4_ = uVar7;
        local_548 = (pBVar30->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        local_5d8._8_8_ = 0;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        flags = pBVar30->flags;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        auVar234 = local_5d8;
        wi.super_Tuple3<pbrt::Vector3,_float>.z = local_548;
        wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_5d8._0_4_;
        wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_5d8._4_4_;
        local_5d8 = auVar234;
        SurfaceInteraction::SpawnRay
                  ((RayDifferential *)local_328,&pSVar29->intr,ray,&bsdf,wi,flags,pBVar30->eta);
        auVar234 = local_310._16_16_;
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_328._12_4_;
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_328._16_4_;
        *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
             CONCAT44(local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low,local_328._20_4_);
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_328._0_4_;
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_328._4_4_;
        *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(local_328._12_4_,local_328._8_4_);
        (ray->super_Ray).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = CONCAT44(local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                         local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
        IVar19.high = local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        IVar19.low = local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        IVar20.high = local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
        IVar20.low = local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
        *(ulong *)&local_1c8[2].high =
             CONCAT44(local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x,
                      local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z);
        *(ulong *)&local_1c8[3].high =
             CONCAT44(local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
                      local_310.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y);
        *(ulong *)&local_1c8[4].high =
             CONCAT44(local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y,
                      local_310.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x);
        *(ulong *)&local_1c8[5].high = CONCAT44(local_310._64_4_,local_310._60_4_);
        *local_1c8 = local_310.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
        local_1c8[1].low = (Float)local_310._24_4_;
        local_1c8[1].high = local_310.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        local_1c8[2] = IVar19;
        local_1c8[3] = IVar20;
        in_ZMM4 = ZEXT1664(auVar47);
        in_ZMM7 = ZEXT1664(auVar227);
        local_310._16_16_ = auVar234;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_5f8._0_4_;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar6;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar8;
        local_4d8._0_4_ =
             BSDF::PDF(&bsdf,(Vector3f)(pBVar30->wi).super_Tuple3<pbrt::Vector3,_float>,wiRender,
                       (uint)(mode == Radiance),All);
        local_4d8._4_4_ = uVar8;
        local_4d8._8_8_ = 0;
        pBVar30 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        if ((pBVar30->flags & Specular) != Unset) {
          local_4d8 = ZEXT416((uint)uVar8) << 0x20;
          this_00->delta = true;
          pdfFwd = 0.0;
        }
        FVar48 = Vertex::ConvertDensity(this_00,(Float)local_4d8._0_4_,prev);
        this_00[-1].pdfRev = FVar48;
        pstd::optional<pbrt::BSDFSample>::~optional(&bs);
      }
      pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    }
  }
  return bounces;
}

Assistant:

int RandomWalk(const Integrator &integrator, SampledWavelengths &lambda,
               RayDifferential ray, SamplerHandle sampler, CameraHandle camera,
               ScratchBuffer &scratchBuffer, SampledSpectrum beta, Float pdf,
               int maxDepth, TransportMode mode, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Follow random walk to initialize BDPT path vertices
    int bounces = 0;
    bool anyNonSpecularBounces = false;
    Float pdfFwd = pdf;
    while (true) {
        // Attempt to create the next subpath vertex in _path_
        PBRT_DBG("%s\n", StringPrintf("Random walk. Bounces %d, beta %s, pdfFwd %f",
                                      bounces, beta, pdfFwd)
                             .c_str());
        if (!beta)
            break;
        bool scattered = false, terminated = false;
        // Trace a ray and sample the medium, if any
        Vertex &vertex = path[bounces], &prev = path[bounces - 1];
        pstd::optional<ShapeIntersection> si = integrator.Intersect(ray);
        if (ray.medium) {
            // Sample participating medium for _RandomWalk()_ ray
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(ray.d.x), Hash(ray.d.y));
            Float u = sampler.Get1D();
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                    const MediumInteraction &intr = ms.intr;
                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    // Randomly sample medium event for _RandomRalk()_ ray
                    Float um = sampler.Get1D();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption for _RandomWalk()_ ray
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering for _RandomWalk()_ ray
                        beta *= ms.Tmaj * intr.sigma_s / (ms.Tmaj[0] * intr.sigma_s[0]);
                        // Record medium interaction in _path_ and compute forward density
                        vertex = Vertex::CreateMedium(intr, beta, pdfFwd, prev);
                        if (++bounces >= maxDepth) {
                            terminated = true;
                            return false;
                        }

                        // Sample direction and compute reverse density at preceding
                        // vertex
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update path state and previous path verex after medium
                        // scattering
                        pdfFwd = ps->pdf;
                        beta *= ps->p / ps->pdf;
                        ray = intr.SpawnRay(ps->wi);
                        anyNonSpecularBounces = true;
                        prev.pdfRev = vertex.ConvertDensity(ps->pdf, prev);

                        scattered = true;
                        return false;

                    } else {
                        // Handle null scattering for _RandomWalk()_ ray
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= ms.Tmaj * sigma_n / (ms.Tmaj[0] * sigma_n[0]);
                        return true;
                    }
                });
            // Update _beta_ for medium transmittance
            if (!scattered)
                beta *= Tmaj / Tmaj[0];
        }

        if (terminated)
            return bounces;
        if (scattered)
            continue;
        // Handle escaped rays after no medium scattering event
        if (!si) {
            // Capture escaped rays when tracing from the camera
            if (mode == TransportMode::Radiance) {
                vertex = Vertex::CreateLight(EndpointInteraction(ray), beta, pdfFwd);
                ++bounces;
            }

            break;
        }

        // Handle surface interaction for path generation
        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Initialize _vertex_ with surface intersection information
        vertex = Vertex::CreateSurface(isect, bsdf, beta, pdfFwd, prev);

        if (++bounces >= maxDepth)
            break;
        // Sample BSDF at current vertex
        Vector3f wo = isect.wo;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D(), mode);
        if (!bs)
            break;
        pdfFwd = bs->pdf;
        anyNonSpecularBounces |= !bs->IsSpecular();
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Compute path probabilities at surface vertex
        // TODO: confirm. I believe that !mode is right. Interestingly,
        // it makes no difference in the test suite either way.
        Float pdfRev = bsdf.PDF(bs->wi, wo, !mode);
        if (bs->IsSpecular()) {
            vertex.delta = true;
            pdfRev = pdfFwd = 0;
        }
        PBRT_DBG("%s\n",
                 StringPrintf("Random walk beta after shading normal correction %s", beta)
                     .c_str());
        prev.pdfRev = vertex.ConvertDensity(pdfRev, prev);
    }
    return bounces;
}